

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sequence_node.hpp
# Opt level: O2

void __thiscall
ranger::bhvr_tree::
parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  size_t sVar1;
  _Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
  _Var2;
  _Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
  _Var3;
  shared_ptr<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data>
  data;
  __shared_ptr<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  local_98;
  anon_class_56_3_94c78f24 local_88;
  _Function_base local_50;
  
  std::
  make_shared<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::internal_data>
            ();
  sVar1 = (local_98._M_ptr)->count;
  _Var3._M_head_impl =
       (this->
       super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       ).m_first_child._M_t.
       super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       .
       super__Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
       ._M_head_impl;
  for (_Var2._M_head_impl = _Var3._M_head_impl; sVar1 = sVar1 + 1,
      _Var2._M_head_impl !=
      (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *)0x0; _Var2._M_head_impl =
                   *(abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                     **)&(((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                            *)((long)_Var2._M_head_impl + 8))->_M_t).
                         super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
      ) {
    (local_98._M_ptr)->count = sVar1;
  }
  if (sVar1 == 1) {
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::operator()(ap,hdl,(local_98._M_ptr)->result);
  }
  else {
    for (; _Var3._M_head_impl !=
           (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *)0x0;
        _Var3._M_head_impl =
             *(abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               **)((long)_Var3._M_head_impl + 8)) {
      local_88.ap = ap;
      std::
      __shared_ptr<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_88.data.
                      super___shared_ptr<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_98);
      std::function<void_(bool,_test_agent_*)>::function(&local_88.hdl,hdl);
      std::function<void(bool,test_agent*)>::
      function<ranger::bhvr_tree::parallel_sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
                ((function<void(bool,test_agent*)> *)&local_50,&local_88);
      (**(code **)(*(long *)_Var3._M_head_impl + 0x10))(_Var3._M_head_impl,ap,&local_50);
      std::_Function_base::~_Function_base(&local_50);
      const::{lambda(bool,test_agent*)#1}::~exec((_lambda_bool_test_agent___1_ *)&local_88);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    auto data = std::make_shared<internal_data>();
    for (auto node = this->get_first_child(); node; node = node->get_next_sibling()) {
      ++data->count;
    }
    
    if (data->count > 0) {
      for (auto node = this->get_first_child(); node; node = node->get_next_sibling()) {
        node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
          std::lock_guard<mutex_type> lock(data->mtx);
          data->result = data->result && result;
          if (--data->count == 0) {
            ap(hdl, data->result);
          }
        });
      }
    } else {
      ap(hdl, data->result);
    }
  }